

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QMap<QString,_QVariant> __thiscall
QMap<QString,_QMap<QString,_QVariant>_>::value
          (QMap<QString,_QMap<QString,_QVariant>_> *this,QString *key,
          QMap<QString,_QVariant> *defaultValue)

{
  Data *pDVar1;
  const_iterator cVar2;
  QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
  *pQVar3;
  undefined8 *in_RCX;
  
  pDVar1 = (key->d).d;
  if (pDVar1 != (Data *)0x0) {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_QMap<QString,_QVariant>_>,_std::_Select1st<std::pair<const_QString,_QMap<QString,_QVariant>_>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
            ::find((_Rb_tree<QString,_std::pair<const_QString,_QMap<QString,_QVariant>_>,_std::_Select1st<std::pair<const_QString,_QMap<QString,_QVariant>_>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
                    *)&(pDVar1->super_QArrayData).alloc,(key_type *)defaultValue);
    if (cVar2._M_node != (_Base_ptr)((key->d).d + 1)) {
      pQVar3 = (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                *)cVar2._M_node[1]._M_right;
      goto LAB_001119b5;
    }
  }
  pQVar3 = (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
            *)*in_RCX;
LAB_001119b5:
  (this->d).d.ptr = pQVar3;
  if (pQVar3 != (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + _S_black);
    UNLOCK();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )this;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }